

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_http_redirect_hit
              (lws_context_per_thread *pt,lws *wsi,lws_http_mount *hit,char *uri_ptr,int uri_len,
              int *h)

{
  uchar *loc;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  lws_token_indexes h_00;
  undefined4 in_register_00000084;
  char *pcVar6;
  uchar *p;
  uchar *local_30;
  
  *(undefined4 *)CONCAT44(in_register_00000084,uri_len) = 0;
  bVar1 = hit->mountpoint_len;
  if ((((ulong)bVar1 < 2) && ((hit->origin_protocol & 0xfe) != 4)) ||
     ((uri_ptr[bVar1] == '/' && ((hit->origin_protocol & 0xfe) != 4)))) {
    return 0;
  }
  iVar3 = 0;
  if (hit->origin_protocol == '\x03') {
    return 0;
  }
  if (hit->origin_protocol == '\x06') {
    return 0;
  }
  local_30 = pt->serv_buf + 0x10;
  loc = pt->serv_buf + ((ulong)wsi->context->pt_serv_buf_size - 0x200);
  *(undefined4 *)CONCAT44(in_register_00000084,uri_len) = 1;
  _lws_log(8,"Doing 301 \'%s\' org %s\n",uri_ptr + bVar1,hit->origin);
  if ((hit->origin_protocol & 0xfe) == 4) {
    iVar3 = lws_snprintf((char *)loc,0x100,"%s%s",oprot[hit->origin_protocol & 1],hit->origin);
LAB_001348be:
    lws_clean_url((char *)loc);
    iVar4 = lws_http_redirect(wsi,0x12d,loc,iVar3,&local_30,loc);
    if (-1 < iVar4) {
      iVar3 = lws_http_transaction_completed(wsi);
      bVar2 = false;
      goto LAB_001348f6;
    }
  }
  else {
    iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HOST);
    if (iVar4 != 0) {
      iVar3 = lws_is_ssl(wsi);
      pcVar6 = oprot[iVar3 != 0];
      h_00 = WSI_TOKEN_HOST;
LAB_0013489a:
      pcVar5 = lws_hdr_simple_ptr(wsi,h_00);
      iVar3 = lws_snprintf((char *)loc,0x100,"%s%s%s/",pcVar6,pcVar5,uri_ptr);
      goto LAB_001348be;
    }
    iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_AUTHORITY);
    if (iVar4 != 0) {
      iVar3 = lws_is_ssl(wsi);
      pcVar6 = oprot[iVar3 != 0];
      h_00 = WSI_TOKEN_HTTP_COLON_AUTHORITY;
      goto LAB_0013489a;
    }
  }
  bVar2 = true;
LAB_001348f6:
  if (bVar2) {
    iVar3 = 1;
    lws_header_table_detach(wsi,1);
  }
  return iVar3;
}

Assistant:

static int
lws_http_redirect_hit(struct lws_context_per_thread *pt, struct lws *wsi,
		      const struct lws_http_mount *hit, char *uri_ptr,
		      int uri_len, int *h)
{
	char *s;
	int n;

	*h = 0;
	s = uri_ptr + hit->mountpoint_len;

	/*
	 * if we have a mountpoint like https://xxx.com/yyy
	 * there is an implied / at the end for our purposes since
	 * we can only mount on a "directory".
	 *
	 * But if we just go with that, the browser cannot understand
	 * that he is actually looking down one "directory level", so
	 * even though we give him /yyy/abc.html he acts like the
	 * current directory level is /.  So relative urls like "x.png"
	 * wrongly look outside the mountpoint.
	 *
	 * Therefore if we didn't come in on a url with an explicit
	 * / at the end, we must redirect to add it so the browser
	 * understands he is one "directory level" down.
	 */
	if ((hit->mountpoint_len > 1 ||
	     (hit->origin_protocol == LWSMPRO_REDIR_HTTP ||
	      hit->origin_protocol == LWSMPRO_REDIR_HTTPS)) &&
	    (*s != '/' ||
	     (hit->origin_protocol == LWSMPRO_REDIR_HTTP ||
	      hit->origin_protocol == LWSMPRO_REDIR_HTTPS)) &&
	    (hit->origin_protocol != LWSMPRO_CGI &&
	     hit->origin_protocol != LWSMPRO_CALLBACK)) {
		unsigned char *start = pt->serv_buf + LWS_PRE, *p = start,
			      *end = p + wsi->context->pt_serv_buf_size -
					LWS_PRE - 512;

		*h = 1;

		lwsl_info("Doing 301 '%s' org %s\n", s, hit->origin);

		/* > at start indicates deal with by redirect */
		if (hit->origin_protocol == LWSMPRO_REDIR_HTTP ||
		    hit->origin_protocol == LWSMPRO_REDIR_HTTPS)
			n = lws_snprintf((char *)end, 256, "%s%s",
				    oprot[hit->origin_protocol & 1],
				    hit->origin);
		else {
			if (!lws_hdr_total_length(wsi, WSI_TOKEN_HOST)) {
				if (!lws_hdr_total_length(wsi,
						WSI_TOKEN_HTTP_COLON_AUTHORITY))
					goto bail_nuke_ah;
				n = lws_snprintf((char *)end, 256,
				    "%s%s%s/", oprot[!!lws_is_ssl(wsi)],
				    lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_COLON_AUTHORITY),
				    uri_ptr);
			} else
				n = lws_snprintf((char *)end, 256,
				    "%s%s%s/", oprot[!!lws_is_ssl(wsi)],
				    lws_hdr_simple_ptr(wsi, WSI_TOKEN_HOST),
				    uri_ptr);
		}

		lws_clean_url((char *)end);
		n = lws_http_redirect(wsi, HTTP_STATUS_MOVED_PERMANENTLY,
				      end, n, &p, end);
		if ((int)n < 0)
			goto bail_nuke_ah;

		return lws_http_transaction_completed(wsi);
	}

	return 0;

bail_nuke_ah:
	lws_header_table_detach(wsi, 1);

	return 1;
}